

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_serve_http_file_fragment(lws *wsi)

{
  lws_context *plVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  lws_fileofs_t lVar7;
  lws_write_protocol wp;
  lws_filepos_t txc;
  int m;
  int n;
  uchar *pstart;
  uchar *p;
  lws_filepos_t poss;
  lws_filepos_t amount;
  lws_process_html_args args;
  lws_context_per_thread *pt;
  lws_context *context;
  lws *wsi_local;
  
  plVar1 = wsi->context;
  args._16_8_ = plVar1->pt + (int)wsi->tsi;
  _lws_log(0x10,"wsi->mux_substream %d\n",(ulong)((uint)(*(ulong *)&wsi->field_0x2dc >> 1) & 1));
  do {
    iVar3 = lws_has_buffered_out(wsi);
    if (iVar3 != 0) {
      iVar3 = lws_issue_raw(wsi,(uchar *)0x0,0);
      if (iVar3 < 0) {
        _lws_log(8,"%s: closing\n","lws_serve_http_file_fragment");
LAB_0014fdc5:
        lws_vfs_file_close(&(wsi->http).fop_fd);
        return -1;
      }
      break;
    }
    if ((wsi->http).filepos != (wsi->http).filelen) {
      lVar2 = *(long *)(args._16_8_ + 0x128);
      puVar5 = (uchar *)(lVar2 + 9);
      p = (uchar *)(ulong)(plVar1->pt_serv_buf_size - 9);
      if (((wsi->http).tx_content_length != 0) && ((uchar *)(wsi->http).tx_content_remain < p)) {
        p = (uchar *)(wsi->http).tx_content_remain;
      }
      if ((wsi->protocol->tx_packet_size != 0) && ((uchar *)wsi->protocol->tx_packet_size < p)) {
        p = (uchar *)wsi->protocol->tx_packet_size;
      }
      if (wsi->role_ops->tx_credit != (_func_int_lws_ptr_char_int *)0x0) {
        iVar3 = (*wsi->role_ops->tx_credit)(wsi,'\0',0);
        puVar6 = (uchar *)(long)iVar3;
        if (puVar6 == (uchar *)0x0) {
          _lws_log(4,"%s: %p: no tx credit\n","lws_serve_http_file_fragment",wsi);
          return 0;
        }
        if (puVar6 < p) {
          p = puVar6;
        }
      }
      pstart = puVar5;
      if ((*(ulong *)&wsi->field_0x2dc >> 0x14 & 1) != 0) {
        pstart = (uchar *)(lVar2 + 0x13);
        p = p + -0x8a;
      }
      iVar3 = lws_vfs_file_read((wsi->http).fop_fd,&poss,pstart,(lws_filepos_t)p);
      if (iVar3 < 0) goto LAB_0014fdc5;
      txc._4_4_ = (uint)poss;
      if ((*(ulong *)&wsi->field_0x2dc >> 0x14 & 1) == 0) {
        txc._4_4_ = ((int)pstart - (int)puVar5) + txc._4_4_;
      }
      _lws_log(0x10,"%s: sending %d\n","lws_serve_http_file_fragment",(ulong)txc._4_4_);
      if (txc._4_4_ != 0) {
        lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_CONTENT,plVar1->timeout_secs);
        if ((*(ulong *)&wsi->field_0x2dc >> 0x15 & 1) != 0) {
          amount = (lws_filepos_t)pstart;
          args.p._0_4_ = txc._4_4_;
          args.p._4_4_ = (int)p + 0x80;
          args.len = (int)((wsi->http).filepos + (long)(int)txc._4_4_ == (wsi->http).filelen);
          args.max_len = (uint)(*(ulong *)&wsi->field_0x2dc >> 0x14) & 1;
          iVar3 = user_callback_handle_rxflow
                            (wsi->vhost->protocols[(int)wsi->protocol_interpret_idx].callback,wsi,
                             LWS_CALLBACK_PROCESS_HTML,wsi->user_space,&amount,0);
          if (iVar3 < 0) goto LAB_0014fdc5;
          txc._4_4_ = (uint)args.p;
          pstart = (uchar *)amount;
          puVar5 = pstart;
        }
        pstart = puVar5;
        wp = LWS_WRITE_HTTP;
        if ((wsi->http).filepos + poss == (wsi->http).filelen) {
          wp = LWS_WRITE_HTTP_FINAL;
        }
        uVar4 = lws_write(wsi,pstart,(long)(int)txc._4_4_,wp);
        if (((int)uVar4 < 0) ||
           (((wsi->http).filepos = poss + (wsi->http).filepos, uVar4 != txc._4_4_ &&
            (lVar7 = lws_vfs_file_seek_cur((wsi->http).fop_fd,(long)(int)(uVar4 - txc._4_4_)),
            lVar7 == -1)))) goto LAB_0014fdc5;
      }
    }
    iVar3 = lws_has_buffered_out(wsi);
    if ((iVar3 == 0) && ((wsi->http).filelen <= (wsi->http).filepos)) {
      lwsi_set_state(wsi,0x119);
      lws_vfs_file_close(&(wsi->http).fop_fd);
      _lws_log(0x10,"file completed\n");
      if ((wsi->protocol->callback != (lws_callback_function *)0x0) &&
         (iVar3 = user_callback_handle_rxflow
                            (wsi->protocol->callback,wsi,LWS_CALLBACK_HTTP_FILE_COMPLETION,
                             wsi->user_space,(void *)0x0,0), iVar3 < 0)) {
        if ((*(ulong *)&wsi->field_0x2dc >> 1 & 1) != 0) {
          return 1;
        }
        return -1;
      }
      return 1;
    }
    iVar3 = lws_send_pipe_choked(wsi);
  } while (iVar3 == 0);
  lws_callback_on_writable(wsi);
  return 0;
}

Assistant:

int lws_serve_http_file_fragment(struct lws *wsi)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	struct lws_process_html_args args;
	lws_filepos_t amount, poss;
	unsigned char *p, *pstart;
#if defined(LWS_WITH_RANGES)
	unsigned char finished = 0;
#endif
	int n, m;

	lwsl_debug("wsi->mux_substream %d\n", wsi->mux_substream);

	do {

		/* priority 1: buffered output */

		if (lws_has_buffered_out(wsi)) {
			if (lws_issue_raw(wsi, NULL, 0) < 0) {
				lwsl_info("%s: closing\n", __func__);
				goto file_had_it;
			}
			break;
		}

		/* priority 2: buffered pre-compression-transform */

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
	if (wsi->http.comp_ctx.buflist_comp ||
	    wsi->http.comp_ctx.may_have_more) {
		enum lws_write_protocol wp = LWS_WRITE_HTTP;

		lwsl_info("%s: completing comp partial (buflist %p, may %d)\n",
			   __func__, wsi->http.comp_ctx.buflist_comp,
			   wsi->http.comp_ctx.may_have_more);

		if (wsi->role_ops->write_role_protocol(wsi, NULL, 0, &wp) < 0) {
			lwsl_info("%s signalling to close\n", __func__);
			goto file_had_it;
		}
		lws_callback_on_writable(wsi);

		break;
	}
#endif

		if (wsi->http.filepos == wsi->http.filelen)
			goto all_sent;

		n = 0;
		p = pstart = pt->serv_buf + LWS_H2_FRAME_HEADER_LENGTH;

#if defined(LWS_WITH_RANGES)
		if (wsi->http.range.count_ranges && !wsi->http.range.inside) {

			lwsl_notice("%s: doing range start %llu\n", __func__,
				    wsi->http.range.start);

			if ((long long)lws_vfs_file_seek_cur(wsi->http.fop_fd,
						   wsi->http.range.start -
						   wsi->http.filepos) < 0)
				goto file_had_it;

			wsi->http.filepos = wsi->http.range.start;

			if (wsi->http.range.count_ranges > 1) {
				n =  lws_snprintf((char *)p,
						context->pt_serv_buf_size -
						LWS_H2_FRAME_HEADER_LENGTH,
					"_lws\x0d\x0a"
					"Content-Type: %s\x0d\x0a"
					"Content-Range: bytes "
						"%llu-%llu/%llu\x0d\x0a"
					"\x0d\x0a",
					wsi->http.multipart_content_type,
					wsi->http.range.start,
					wsi->http.range.end,
					wsi->http.range.extent);
				p += n;
			}

			wsi->http.range.budget = wsi->http.range.end -
						   wsi->http.range.start + 1;
			wsi->http.range.inside = 1;
		}
#endif

		poss = context->pt_serv_buf_size - n -
				LWS_H2_FRAME_HEADER_LENGTH;

		if (wsi->http.tx_content_length)
			if (poss > wsi->http.tx_content_remain)
				poss = wsi->http.tx_content_remain;

		/*
		 * If there is a hint about how much we will do well to send at
		 * one time, restrict ourselves to only trying to send that.
		 */
		if (wsi->protocol->tx_packet_size &&
		    poss > wsi->protocol->tx_packet_size)
			poss = wsi->protocol->tx_packet_size;

		if (wsi->role_ops->tx_credit) {
			lws_filepos_t txc =
				wsi->role_ops->tx_credit(wsi, LWSTXCR_US_TO_PEER, 0);

			if (!txc) {
				/*
				 * We shouldn't've been able to get the
				 * WRITEABLE if we are skint
				 */
				lwsl_notice("%s: %p: no tx credit\n", __func__,
						wsi);

				return 0;
			}
			if (txc < poss)
				poss = txc;

			/*
			 * Tracking consumption of the actual payload amount
			 * will be handled when the role data frame is sent...
			 */
		}

#if defined(LWS_WITH_RANGES)
		if (wsi->http.range.count_ranges) {
			if (wsi->http.range.count_ranges > 1)
				poss -= 7; /* allow for final boundary */
			if (poss > wsi->http.range.budget)
				poss = wsi->http.range.budget;
		}
#endif
		if (wsi->sending_chunked) {
			/* we need to drop the chunk size in here */
			p += 10;
			/* allow for the chunk to grow by 128 in translation */
			poss -= 10 + 128;
		}

		if (lws_vfs_file_read(wsi->http.fop_fd, &amount, p, poss) < 0)
			goto file_had_it; /* caller will close */

		if (wsi->sending_chunked)
			n = (int)amount;
		else
			n = lws_ptr_diff(p, pstart) + (int)amount;

		lwsl_debug("%s: sending %d\n", __func__, n);

		if (n) {
			lws_set_timeout(wsi, PENDING_TIMEOUT_HTTP_CONTENT,
					context->timeout_secs);

			if (wsi->interpreting) {
				args.p = (char *)p;
				args.len = n;
				args.max_len = (unsigned int)poss + 128;
				args.final = wsi->http.filepos + n ==
					     wsi->http.filelen;
				args.chunked = wsi->sending_chunked;
				if (user_callback_handle_rxflow(
				     wsi->vhost->protocols[
				     (int)wsi->protocol_interpret_idx].callback,
				     wsi, LWS_CALLBACK_PROCESS_HTML,
				     wsi->user_space, &args, 0) < 0)
					goto file_had_it;
				n = args.len;
				p = (unsigned char *)args.p;
			} else
				p = pstart;

#if defined(LWS_WITH_RANGES)
			if (wsi->http.range.send_ctr + 1 ==
				wsi->http.range.count_ranges && // last range
			    wsi->http.range.count_ranges > 1 && // was 2+ ranges (ie, multipart)
			    wsi->http.range.budget - amount == 0) {// final part
				n += lws_snprintf((char *)pstart + n, 6,
					"_lws\x0d\x0a"); // append trailing boundary
				lwsl_debug("added trailing boundary\n");
			}
#endif
			m = lws_write(wsi, p, n, wsi->http.filepos + amount ==
					wsi->http.filelen ?
					 LWS_WRITE_HTTP_FINAL : LWS_WRITE_HTTP);
			if (m < 0)
				goto file_had_it;

			wsi->http.filepos += amount;

#if defined(LWS_WITH_RANGES)
			if (wsi->http.range.count_ranges >= 1) {
				wsi->http.range.budget -= amount;
				if (wsi->http.range.budget == 0) {
					lwsl_notice("range budget exhausted\n");
					wsi->http.range.inside = 0;
					wsi->http.range.send_ctr++;

					if (lws_ranges_next(&wsi->http.range) < 1) {
						finished = 1;
						goto all_sent;
					}
				}
			}
#endif

			if (m != n) {
				/* adjust for what was not sent */
				if (lws_vfs_file_seek_cur(wsi->http.fop_fd,
							   m - n) ==
							     (lws_fileofs_t)-1)
					goto file_had_it;
			}
		}

all_sent:
		if ((!lws_has_buffered_out(wsi)
#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
				&& !wsi->http.comp_ctx.buflist_comp &&
		    !wsi->http.comp_ctx.may_have_more
#endif
		    ) && (wsi->http.filepos >= wsi->http.filelen
#if defined(LWS_WITH_RANGES)
		    || finished)
#else
		)
#endif
		) {
			lwsi_set_state(wsi, LRS_ESTABLISHED);
			/* we might be in keepalive, so close it off here */
			lws_vfs_file_close(&wsi->http.fop_fd);

			lwsl_debug("file completed\n");

			if (wsi->protocol->callback &&
			    user_callback_handle_rxflow(wsi->protocol->callback,
					wsi, LWS_CALLBACK_HTTP_FILE_COMPLETION,
					wsi->user_space, NULL, 0) < 0) {
					/*
					 * For http/1.x, the choices from
					 * transaction_completed are either
					 * 0 to use the connection for pipelined
					 * or nonzero to hang it up.
					 *
					 * However for http/2. while we are
					 * still interested in hanging up the
					 * nwsi if there was a network-level
					 * fatal error, simply completing the
					 * transaction is a matter of the stream
					 * state, not the root connection at the
					 * network level
					 */
					if (wsi->mux_substream)
						return 1;
					else
						return -1;
				}

			return 1;  /* >0 indicates completed */
		}
		/*
		 * while(1) here causes us to spam the whole file contents into
		 * a hugely bloated output buffer if it ever can't send the
		 * whole chunk...
		 */
	} while (!lws_send_pipe_choked(wsi));

	lws_callback_on_writable(wsi);

	return 0; /* indicates further processing must be done */

file_had_it:
	lws_vfs_file_close(&wsi->http.fop_fd);

	return -1;
}